

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemSubroutine.cpp
# Opt level: O3

bool __thiscall
slang::ast::SystemSubroutine::checkArgCount
          (SystemSubroutine *this,ASTContext *context,bool isMethod,Args *args,SourceRange callRange
          ,size_t min,size_t max)

{
  pointer ppEVar1;
  bool bVar2;
  Diagnostic *pDVar3;
  DiagCode code;
  SourceLocation SVar4;
  SourceLocation SVar5;
  size_t sVar6;
  ulong uVar7;
  long lVar8;
  Args *__range2;
  SourceRange sourceRange;
  size_t local_50;
  SourceLocation local_48;
  SourceLocation local_40;
  ASTContext *local_38;
  
  SVar5 = callRange.endLoc;
  SVar4 = callRange.startLoc;
  sVar6 = (args->_M_extent)._M_extent_value;
  if (sVar6 == 0) {
    sVar6 = 0;
  }
  else {
    ppEVar1 = args->_M_ptr;
    lVar8 = 0;
    local_48 = SVar4;
    local_40 = SVar5;
    local_38 = context;
    do {
      bVar2 = Expression::bad(*(Expression **)((long)ppEVar1 + lVar8));
      if (bVar2) {
        return false;
      }
      lVar8 = lVar8 + 8;
    } while (sVar6 << 3 != lVar8);
    sVar6 = (args->_M_extent)._M_extent_value;
    context = local_38;
    SVar4 = local_48;
    SVar5 = local_40;
  }
  uVar7 = sVar6 - isMethod;
  if (uVar7 < min) {
    code.subsystem = Expressions;
    code.code = 0x9f;
  }
  else {
    if (uVar7 <= max) {
      return true;
    }
    SVar4 = (args->_M_ptr[max]->sourceRange).startLoc;
    SVar5 = (args->_M_ptr[max]->sourceRange).endLoc;
    code.subsystem = Expressions;
    code.code = 0xa0;
    min = max;
  }
  sourceRange.endLoc = SVar5;
  sourceRange.startLoc = SVar4;
  pDVar3 = ASTContext::addDiag(context,code,sourceRange);
  pDVar3 = Diagnostic::operator<<(pDVar3,&this->name);
  local_50 = min;
  std::
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  ::emplace_back<unsigned_long>(&pDVar3->args,&local_50);
  local_50 = uVar7;
  std::
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  ::emplace_back<unsigned_long>(&pDVar3->args,&local_50);
  return false;
}

Assistant:

bool SystemSubroutine::checkArgCount(const ASTContext& context, bool isMethod, const Args& args,
                                     SourceRange callRange, size_t min, size_t max) const {
    for (auto arg : args) {
        if (arg->bad())
            return false;
    }

    size_t provided = args.size();
    if (isMethod) {
        SLANG_ASSERT(provided);
        provided--;
    }

    if (provided < min) {
        context.addDiag(diag::TooFewArguments, callRange) << name << min << provided;
        return false;
    }

    if (provided > max) {
        context.addDiag(diag::TooManyArguments, args[max]->sourceRange) << name << max << provided;
        return false;
    }

    return true;
}